

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

void Lf_ManSetFlowRefs(Gia_Man_t *p,Vec_Flt_t *vRefs,Vec_Int_t *vOffsets)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  long lVar8;
  Gia_Obj_t *pObj;
  float Entry;
  float fVar9;
  Gia_Obj_t *pData1;
  Gia_Obj_t *pData0;
  Gia_Obj_t *local_40;
  Gia_Obj_t *local_38;
  
  iVar1 = Gia_ManAndNotBufNum(p);
  Vec_FltFill(vRefs,iVar1,Entry);
  for (lVar8 = 0; lVar8 < p->nObjs; lVar8 = lVar8 + 1) {
    iVar1 = (int)lVar8;
    pGVar4 = Gia_ManObj(p,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar7 = (uint)*(ulong *)pGVar4;
    uVar5 = *(ulong *)pGVar4 & 0x1fffffff;
    if (uVar5 != 0x1fffffff && -1 < (int)uVar7) {
      iVar2 = Gia_ObjIsAndNotBuf(pGVar4 + -uVar5);
      if (iVar2 != 0) {
        iVar2 = Vec_IntEntry(vOffsets,iVar1 - (uVar7 & 0x1fffffff));
        Vec_FltAddToEntry(vRefs,iVar2,1.0);
      }
      iVar2 = Gia_ObjIsBuf(pGVar4);
      if (iVar2 == 0) {
        uVar7 = (uint)((ulong)*(undefined8 *)pGVar4 >> 0x20);
        iVar2 = Gia_ObjIsAndNotBuf(pGVar4 + -(ulong)(uVar7 & 0x1fffffff));
        if (iVar2 != 0) {
          iVar2 = Vec_IntEntry(vOffsets,iVar1 - (uVar7 & 0x1fffffff));
          Vec_FltAddToEntry(vRefs,iVar2,1.0);
        }
        if (p->pMuxes == (uint *)0x0) {
          iVar1 = Gia_ObjIsMuxType(pGVar4);
          if (iVar1 != 0) {
            pGVar6 = Gia_ObjRecognizeMux(pGVar4,&local_40,&local_38);
            pObj = (Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe);
            pGVar4 = (Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe);
            local_40 = pGVar4;
            local_38 = pObj;
            iVar1 = Gia_ObjIsAndNotBuf((Gia_Obj_t *)((ulong)pGVar6 & 0xfffffffffffffffe));
            if (iVar1 != 0) {
              iVar1 = Gia_ObjId(p,(Gia_Obj_t *)((ulong)pGVar6 & 0xfffffffffffffffe));
              iVar1 = Vec_IntEntry(vOffsets,iVar1);
              Vec_FltAddToEntry(vRefs,iVar1,-1.0);
              pGVar4 = local_40;
              pObj = local_38;
            }
            if (pObj == pGVar4) {
              iVar1 = Gia_ObjIsAndNotBuf(pObj);
              if (iVar1 != 0) {
                iVar1 = Gia_ObjId(p,pObj);
                fVar9 = -1.0;
                goto LAB_005ef170;
              }
            }
          }
        }
        else if (p->pMuxes[lVar8] != 0) {
          pGVar4 = Gia_ObjFanin2(p,pGVar4);
          iVar2 = Gia_ObjIsAndNotBuf(pGVar4);
          if (iVar2 != 0) {
            iVar1 = Gia_ObjFaninId2(p,iVar1);
            fVar9 = 1.0;
LAB_005ef170:
            iVar1 = Vec_IntEntry(vOffsets,iVar1);
            Vec_FltAddToEntry(vRefs,iVar1,fVar9);
          }
        }
      }
    }
  }
  for (iVar1 = 0; iVar1 < p->vCos->nSize; iVar1 = iVar1 + 1) {
    pGVar4 = Gia_ManCo(p,iVar1);
    iVar2 = Gia_ObjFaninId0p(p,pGVar4);
    pGVar4 = Gia_ManObj(p,iVar2);
    iVar3 = Gia_ObjIsAndNotBuf(pGVar4);
    if (iVar3 != 0) {
      iVar2 = Vec_IntEntry(vOffsets,iVar2);
      Vec_FltAddToEntry(vRefs,iVar2,1.0);
    }
  }
  lVar8 = 0;
  do {
    if (vRefs->nSize <= lVar8) {
      return;
    }
    fVar9 = Vec_FltEntry(vRefs,(int)lVar8);
    if (fVar9 < 1.0) {
      if (vRefs->nSize <= lVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                      ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
      }
      vRefs->pArray[lVar8] = 1.0;
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

void Lf_ManSetFlowRefs( Gia_Man_t * p, Vec_Flt_t * vRefs, Vec_Int_t * vOffsets )
{
    int fDiscount = 1;
    Gia_Obj_t * pObj, * pCtrl, * pData0, * pData1; 
    int i, Id;
    Vec_FltFill( vRefs, Gia_ManAndNotBufNum(p), 0 );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Gia_ObjIsAndNotBuf(Gia_ObjFanin0(pObj)) )
            Vec_FltAddToEntry( vRefs, Vec_IntEntry(vOffsets, Gia_ObjFaninId0(pObj, i)), 1 );
        if ( Gia_ObjIsBuf(pObj) )
            continue;
        if ( Gia_ObjIsAndNotBuf(Gia_ObjFanin1(pObj)) )
            Vec_FltAddToEntry( vRefs, Vec_IntEntry(vOffsets, Gia_ObjFaninId1(pObj, i)), 1 );
        if ( p->pMuxes )
        {
            if ( Gia_ObjIsMuxId(p, i) && Gia_ObjIsAndNotBuf(Gia_ObjFanin2(p, pObj)) )
                Vec_FltAddToEntry( vRefs, Vec_IntEntry(vOffsets, Gia_ObjFaninId2(p, i)), 1 );
        }
        else if ( fDiscount && Gia_ObjIsMuxType(pObj) ) // discount XOR/MUX
        {
            pCtrl  = Gia_Regular(Gia_ObjRecognizeMux(pObj, &pData1, &pData0));
            pData0 = Gia_Regular(pData0);
            pData1 = Gia_Regular(pData1);
            if ( Gia_ObjIsAndNotBuf(pCtrl) )
                Vec_FltAddToEntry( vRefs, Vec_IntEntry(vOffsets, Gia_ObjId(p, pCtrl)), -1 );
            if ( pData0 == pData1 && Gia_ObjIsAndNotBuf(pData0) )
                Vec_FltAddToEntry( vRefs, Vec_IntEntry(vOffsets, Gia_ObjId(p, pData0)), -1 );
        }
    }
    Gia_ManForEachCoDriverId( p, Id, i )
        if ( Gia_ObjIsAndNotBuf(Gia_ManObj(p, Id)) )
            Vec_FltAddToEntry( vRefs, Vec_IntEntry(vOffsets, Id), 1 );
    for ( i = 0; i < Vec_FltSize(vRefs); i++ )
        Vec_FltUpdateEntry( vRefs, i, 1 );
}